

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionBody::EnsureAuxStatementData(FunctionBody *this)

{
  Type *addr;
  Recycler *alloc;
  AuxStatementData *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if ((this->m_sourceInfo).m_auxStatementData.ptr != (AuxStatementData *)0x0) {
    return;
  }
  addr = &(this->m_sourceInfo).m_auxStatementData;
  local_48 = (undefined1  [8])&AuxStatementData::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab601b;
  data.filename._0_4_ = 0x1f38;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     recycler,(TrackAllocData *)local_48);
  this_00 = (AuxStatementData *)new<Memory::Recycler>(0x10,alloc,0x38bbb2);
  AuxStatementData::AuxStatementData(this_00);
  Memory::Recycler::WBSetBit((char *)addr);
  (this->m_sourceInfo).m_auxStatementData.ptr = this_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void FunctionBody::EnsureAuxStatementData()
    {
        if (m_sourceInfo.m_auxStatementData == nullptr)
        {
            Recycler* recycler = m_scriptContext->GetRecycler();

            // Note: allocating must be consistent with clean up in CleanupToReparse.
            m_sourceInfo.m_auxStatementData = RecyclerNew(recycler, AuxStatementData);
        }
    }